

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O1

HttpResponse<false> * __thiscall
uWS::HttpResponse<false>::writeHeader(HttpResponse<false> *this,string_view key,string_view value)

{
  string_view status;
  
  status._M_str = "200 OK";
  status._M_len = 6;
  writeStatus(this,status);
  AsyncSocket<false>::write
            ((AsyncSocket<false> *)this,(int)key._M_str,(void *)(key._M_len & 0xffffffff),0);
  AsyncSocket<false>::write((AsyncSocket<false> *)this,0x153095,(void *)0x2,0);
  AsyncSocket<false>::write
            ((AsyncSocket<false> *)this,(int)value._M_str,(void *)(value._M_len & 0xffffffff),0);
  AsyncSocket<false>::write((AsyncSocket<false> *)this,0x153084,(void *)0x2,0);
  return this;
}

Assistant:

HttpResponse *writeHeader(std::string_view key, std::string_view value) {
        writeStatus(HTTP_200_OK);

        Super::write(key.data(), (int) key.length());
        Super::write(": ", 2);
        Super::write(value.data(), (int) value.length());
        Super::write("\r\n", 2);
        return this;
    }